

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall
NNTreeImpl::find(iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
                bool return_prev_if_not_found)

{
  QPDFExc *e;
  QPDFObjectHandle local_38;
  byte local_21;
  QPDFObjectHandle *pQStack_20;
  bool return_prev_if_not_found_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  local_21 = return_prev_if_not_found;
  pQStack_20 = key;
  key_local = (QPDFObjectHandle *)this;
  this_local = (NNTreeImpl *)__return_storage_ptr__;
  QPDFObjectHandle::QPDFObjectHandle(&local_38,key);
  findInternal(__return_storage_ptr__,this,&local_38,(bool)(local_21 & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::find(QPDFObjectHandle key, bool return_prev_if_not_found)
{
    try {
        return findInternal(key, return_prev_if_not_found);
    } catch (QPDFExc& e) {
        if (this->auto_repair) {
            QTC::TC("qpdf", "NNTree repair");
            warn(qpdf, this->oh, std::string("attempting to repair after error: ") + e.what());
            repair();
            return findInternal(key, return_prev_if_not_found);
        } else {
            throw;
        }
    }
}